

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinImporter::ReadBinaryMaterial(AssbinImporter *this,IOStream *stream,aiMaterial *mat)

{
  undefined1 auVar1 [16];
  uint uVar2;
  DeadlyImportError *this_00;
  ulong uVar3;
  aiMaterialProperty **ppaVar4;
  aiMaterialProperty *this_01;
  uint local_5c;
  uint i;
  allocator local_41;
  string local_40;
  aiMaterial *local_20;
  aiMaterial *mat_local;
  IOStream *stream_local;
  AssbinImporter *this_local;
  
  local_20 = mat;
  mat_local = (aiMaterial *)stream;
  stream_local = (IOStream *)this;
  uVar2 = Read<unsigned_int>(stream);
  if (uVar2 == 0x123d) {
    Read<unsigned_int>((IOStream *)mat_local);
    uVar2 = Read<unsigned_int>((IOStream *)mat_local);
    local_20->mNumProperties = uVar2;
    local_20->mNumAllocated = uVar2;
    if (local_20->mNumProperties != 0) {
      if ((local_20->mProperties != (aiMaterialProperty **)0x0) &&
         (local_20->mProperties != (aiMaterialProperty **)0x0)) {
        operator_delete__(local_20->mProperties);
      }
      auVar1 = ZEXT416(local_20->mNumProperties) * ZEXT816(8);
      uVar3 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      ppaVar4 = (aiMaterialProperty **)operator_new__(uVar3);
      local_20->mProperties = ppaVar4;
      for (local_5c = 0; local_5c < local_20->mNumProperties; local_5c = local_5c + 1) {
        this_01 = (aiMaterialProperty *)operator_new(0x420);
        aiMaterialProperty::aiMaterialProperty(this_01);
        local_20->mProperties[local_5c] = this_01;
        ReadBinaryMaterialProperty(this,(IOStream *)mat_local,local_20->mProperties[local_5c]);
      }
    }
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Magic chunk identifiers are wrong!",&local_41);
  DeadlyImportError::DeadlyImportError(this_00,&local_40);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void AssbinImporter::ReadBinaryMaterial(IOStream * stream, aiMaterial* mat) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AIMATERIAL)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    mat->mNumAllocated = mat->mNumProperties = Read<unsigned int>(stream);
    if (mat->mNumProperties)
    {
        if (mat->mProperties)
        {
            delete[] mat->mProperties;
        }
        mat->mProperties = new aiMaterialProperty*[mat->mNumProperties];
        for (unsigned int i = 0; i < mat->mNumProperties;++i) {
            mat->mProperties[i] = new aiMaterialProperty();
            ReadBinaryMaterialProperty( stream, mat->mProperties[i]);
        }
    }
}